

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.cpp
# Opt level: O2

int ReadHashTable(int depth,int alpha,int beta,Movement *move)

{
  int iVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  
  uVar5 = (ulong)(((uint)ZobristKey & 0xffffff) << 5);
  lVar6 = (long)&HashTable->check + uVar5;
  if (ZobristKeyCheck != *(UINT64 *)((long)&HashTable->check + uVar5)) {
    if (ZobristKeyCheck != *(UINT64 *)(lVar6 + 0x20)) {
      return 0x100000;
    }
    lVar6 = lVar6 + 0x20;
  }
  if (depth < *(int *)(lVar6 + 8)) {
    iVar7 = 0;
    if (0x26f8 < *(int *)(lVar6 + 0xc)) {
      iVar7 = step;
    }
    iVar1 = *(int *)(lVar6 + 0x10);
    iVar7 = *(int *)(lVar6 + 0xc) - iVar7;
    iVar4 = 0;
    if (iVar7 < -0x26f8) {
      iVar4 = step;
    }
    iVar4 = iVar4 + iVar7;
    if (iVar1 == 0) {
      return iVar4;
    }
    if (iVar1 == 2) {
      if (beta <= iVar4) {
        return beta;
      }
    }
    else if ((iVar1 == 1) && (iVar4 <= alpha)) {
      return alpha;
    }
  }
  uVar3 = *(undefined8 *)(lVar6 + 0x14);
  uVar2 = *(undefined4 *)(lVar6 + 0x1c);
  move->catc = (char)uVar2;
  move->movec = (char)((uint)uVar2 >> 8);
  *(short *)&move->field_0xa = (short)((uint)uVar2 >> 0x10);
  move->from = (char)uVar3;
  move->to = (char)((ulong)uVar3 >> 8);
  move->capture = (char)((ulong)uVar3 >> 0x10);
  move->field_0x3 = (char)((ulong)uVar3 >> 0x18);
  move->value = (int)((ulong)uVar3 >> 0x20);
  return 0x100000;
}

Assistant:

int ReadHashTable(int depth, int alpha, int beta, Movement& move){
    int index = ZobristKey & HASHTABLE_MASK;

    for(int i = 0; i < 2; i++){
        HashNode hash_node = HashTable[index + i];
        // 判断校验值是否正确
        if(ZobristKeyCheck == hash_node.check){
            // 获取到的置换表结点的搜索深度应该较大才能认为是有效的
            if(hash_node.depth > depth){
                // 调整至相对值
                if(hash_node.value > WIN_VALUE){
                    hash_node.value -= step;
                }
                if(hash_node.value < -WIN_VALUE){
                    hash_node.value += step;
                }

                // PV结点 直接返回置换表中的值
                if(hash_node.type == hashEXACT){
                    return hash_node.value;
                }
                // alpha结点
                else if(hash_node.type == hashALPHA && hash_node.value <= alpha){
                    return alpha;
                }
                // beta结点
                else if(hash_node.type == hashBETA && hash_node.value >= beta){
                    return beta;
                }
            }
            // 读取失败就获得该局面的最佳走法
            move = hash_node.good_move;
            break;
        }
    }
    return NONE_VALUE;
}